

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async_log_helper.h
# Opt level: O2

void __thiscall
spdlog::details::async_log_helper::push_msg(async_log_helper *this,async_msg *new_msg)

{
  bool bVar1;
  time_point now;
  time_point last_op_time;
  time_point local_30;
  time_point local_28;
  
  bVar1 = mpmc_bounded_queue<spdlog::details::async_log_helper::async_msg>::enqueue
                    (&this->_q,new_msg);
  if ((!bVar1) && (this->_overflow_policy != discard_log_msg)) {
    local_30.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    local_28.__d.__r = local_30.__d.__r;
    do {
      local_30.__d.__r = (duration)std::chrono::_V2::system_clock::now();
      sleep_or_yield(&local_30,&local_28);
      bVar1 = mpmc_bounded_queue<spdlog::details::async_log_helper::async_msg>::enqueue
                        (&this->_q,new_msg);
    } while (!bVar1);
  }
  return;
}

Assistant:

inline void spdlog::details::async_log_helper::push_msg(details::async_log_helper::async_msg &&new_msg)
{
    if (!_q.enqueue(std::move(new_msg)) && _overflow_policy != async_overflow_policy::discard_log_msg)
    {
        auto last_op_time = details::os::now();
        auto now = last_op_time;
        do
        {
            now = details::os::now();
            sleep_or_yield(now, last_op_time);
        } while (!_q.enqueue(std::move(new_msg)));
    }
}